

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

bool __thiscall
FBehavior::CopyStringToArray(FBehavior *this,int arraynum,int index,int maxLength,char *string)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  
  bVar3 = false;
  if ((-1 < index) && (bVar3 = false, (uint)arraynum < (uint)this->NumTotalArrays)) {
    iVar1 = this->Arrays[arraynum]->ArraySize - index;
    if (maxLength <= iVar1) {
      iVar1 = maxLength;
    }
    if (0 < iVar1) {
      piVar2 = this->Arrays[arraynum]->Elements + (uint)index;
      iVar1 = iVar1 + 1;
      do {
        *piVar2 = (int)*string;
        if (*string == '\0') {
          return true;
        }
        string = string + 1;
        piVar2 = piVar2 + 1;
        iVar1 = iVar1 + -1;
      } while (1 < iVar1);
    }
    bVar3 = *string == '\0';
  }
  return bVar3;
}

Assistant:

inline bool FBehavior::CopyStringToArray(int arraynum, int index, int maxLength, const char *string)
{
	 // false if the operation was incomplete or unsuccessful

	if ((unsigned)arraynum >= (unsigned)NumTotalArrays || index < 0)
		return false;
	const ArrayInfo *array = Arrays[arraynum];
	
	if ((signed)array->ArraySize - index < maxLength) maxLength = (signed)array->ArraySize - index;

	while (maxLength-- > 0)
	{
		array->Elements[index++] = *string;
		if (!(*string)) return true; // written terminating 0
		string++;
	}
	return !(*string); // return true if only terminating 0 was not written
}